

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  pointer paVar1;
  pointer puVar2;
  uint *puVar3;
  pointer paVar4;
  pointer paVar5;
  pointer paVar6;
  value_type_conflict3 *pvVar7;
  pointer ppSVar8;
  ShapeGeometry *this_00;
  pointer ppaVar9;
  pointer ppaVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  aiAnimMesh *paVar16;
  aiAnimMesh **ppaVar17;
  FBXConverter *this_01;
  size_type sVar18;
  uint uVar19;
  uint uVar20;
  aiVector2D *v;
  aiMesh *out;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar22;
  aiVector3D *paVar23;
  ulong *puVar24;
  aiFace *paVar25;
  uint *puVar26;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar27;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar28;
  string *this_02;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar29;
  pointer paVar30;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar31;
  aiColor4D *__s;
  Skin *pSVar32;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar33
  ;
  pointer ppBVar34;
  pointer ppBVar35;
  pointer puVar36;
  uint *puVar37;
  aiAnimMesh **ppaVar38;
  ulong uVar39;
  pointer paVar40;
  size_t sVar41;
  uint i;
  iterator iVar42;
  MeshGeometry *geo;
  int iVar43;
  long lVar44;
  size_t __n;
  aiFace *f;
  aiFace *paVar45;
  long lVar46;
  ulong uVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  aiAnimMesh *animMesh;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  aiAnimMesh *local_f0;
  float local_e8;
  float local_e4;
  BlendShapeChannel *local_e0;
  aiMatrix4x4 *local_d8;
  Model *local_d0;
  aiAnimMesh **local_c8;
  iterator iStack_c0;
  aiAnimMesh **local_b8;
  FBXConverter *local_a8;
  MatIndexArray *local_a0;
  string local_98;
  MeshGeometry *local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  ulong local_48;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_40;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_38;
  
  local_d8 = node_global_transform;
  local_d0 = model;
  local_a0 = MeshGeometry::GetMaterialIndices(mesh);
  local_a8 = this;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  pvVar21 = MeshGeometry::GetVertices(mesh);
  pvVar22 = MeshGeometry::GetFaceIndexCounts(mesh);
  out->mNumVertices =
       (int)((ulong)((long)(pvVar21->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar21->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar1 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = ((long)paVar1 - (long)paVar40 >> 2) * -0x5555555555555555;
  uVar47 = 0xffffffffffffffff;
  if (SUB168(auVar11 * ZEXT816(0xc),8) == 0) {
    uVar47 = SUB168(auVar11 * ZEXT816(0xc),0);
  }
  paVar23 = (aiVector3D *)operator_new__(uVar47);
  lVar46 = (long)paVar1 - (long)paVar40;
  if (lVar46 != 0) {
    memset(paVar23,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mVertices = paVar23;
  paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar41 = (long)(pvVar21->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar40;
  if (sVar41 != 0) {
    memmove(paVar23,paVar40,sVar41);
  }
  out->mNumFaces =
       (uint)((ulong)((long)(pvVar22->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar36 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar2 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar46 = (long)puVar36 - (long)puVar2;
  uVar47 = lVar46 >> 2;
  puVar24 = (ulong *)operator_new__(-(ulong)(uVar47 >> 0x3c != 0) | lVar46 * 4 + 8U);
  paVar45 = (aiFace *)(puVar24 + 1);
  *puVar24 = uVar47;
  if (puVar36 != puVar2) {
    paVar25 = paVar45;
    do {
      paVar25->mNumIndices = 0;
      paVar25->mIndices = (uint *)0x0;
      paVar25 = paVar25 + 1;
    } while (paVar25 != paVar45 + uVar47);
  }
  out->mFaces = paVar45;
  puVar37 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar37 != puVar3) {
    iVar43 = 0;
    do {
      uVar20 = *puVar37;
      uVar47 = (ulong)uVar20;
      paVar45->mNumIndices = uVar20;
      puVar26 = (uint *)operator_new__(uVar47 * 4);
      paVar45->mIndices = puVar26;
      uVar19 = 8;
      if (uVar20 - 1 < 3) {
        uVar19 = *(uint *)(&DAT_001f26e4 + (ulong)(uVar20 - 1) * 4);
      }
      out->mPrimitiveTypes = uVar19 | out->mPrimitiveTypes;
      if (uVar47 != 0) {
        uVar39 = 0;
        do {
          paVar45->mIndices[uVar39] = iVar43 + (int)uVar39;
          uVar39 = uVar39 + 1;
        } while (uVar47 != uVar39);
        iVar43 = iVar43 + (int)uVar39;
      }
      paVar45 = paVar45 + 1;
      puVar37 = puVar37 + 1;
    } while (puVar37 != puVar3);
  }
  pvVar27 = MeshGeometry::GetNormals(mesh);
  paVar40 = (pvVar27->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  paVar1 = (pvVar27->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar40 != paVar1) {
    paVar4 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar5 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar46 = (long)paVar5 - (long)paVar4;
    if ((long)paVar40 - (long)paVar1 != lVar46) goto LAB_00176c96;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (lVar46 >> 2) * -0x5555555555555555;
    uVar47 = 0xffffffffffffffff;
    if (SUB168(auVar12 * ZEXT816(0xc),8) == 0) {
      uVar47 = SUB168(auVar12 * ZEXT816(0xc),0);
    }
    paVar23 = (aiVector3D *)operator_new__(uVar47);
    lVar46 = (long)paVar5 - (long)paVar4;
    if (lVar46 != 0) {
      memset(paVar23,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mNormals = paVar23;
    paVar40 = (pvVar27->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar41 = (long)(pvVar27->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar40;
    if (sVar41 != 0) {
      memmove(paVar23,paVar40,sVar41);
    }
  }
  pvVar28 = MeshGeometry::GetTangents(mesh);
  this_02 = (string *)MeshGeometry::GetBinormals(mesh);
  if ((pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    if ((pointer)this_02->_M_string_length ==
        (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
         &this_02->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start) {
      lVar46 = (long)(pvVar27->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar27->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar46 == 0) {
        this_02 = (string *)0x0;
      }
      else {
        this_02 = &local_98;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_02,
                   (lVar46 >> 2) * -0x5555555555555555);
        paVar40 = (pvVar28->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar40) {
          uVar20 = 1;
          uVar47 = 0;
          do {
            paVar1 = (pvVar27->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            fVar49 = paVar1[uVar47].x;
            fVar50 = paVar1[uVar47].y;
            fVar51 = paVar40[uVar47].x;
            fVar52 = paVar40[uVar47].y;
            *(ulong *)(local_98._M_dataplus._M_p + uVar47 * 0xc) =
                 CONCAT44(paVar1[uVar47].z * fVar51 - paVar40[uVar47].z * fVar49,
                          fVar50 * paVar40[uVar47].z - fVar52 * paVar1[uVar47].z);
            *(float *)(local_98._M_dataplus._M_p + uVar47 * 0xc + 8) =
                 fVar49 * fVar52 - fVar51 * fVar50;
            uVar47 = (ulong)uVar20;
            paVar40 = (pvVar28->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar39 = ((long)(pvVar28->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar40 >> 2) *
                     -0x5555555555555555;
            uVar20 = uVar20 + 1;
          } while (uVar47 <= uVar39 && uVar39 - uVar47 != 0);
        }
      }
    }
    if (this_02 != (string *)0x0) {
      paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar1 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar46 = (long)paVar1 - (long)paVar40;
      if ((long)(pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start != lVar46) {
        __assert_fail("tangents.size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0x461,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      if ((long)this_02->_M_string_length -
          (long)(((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &this_02->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start != lVar46) {
        __assert_fail("binormals->size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0x462,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (lVar46 >> 2) * -0x5555555555555555;
      uVar47 = 0xffffffffffffffff;
      if (SUB168(auVar13 * ZEXT816(0xc),8) == 0) {
        uVar47 = SUB168(auVar13 * ZEXT816(0xc),0);
      }
      paVar23 = (aiVector3D *)operator_new__(uVar47);
      lVar46 = (long)paVar1 - (long)paVar40;
      if (lVar46 != 0) {
        memset(paVar23,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mTangents = paVar23;
      paVar40 = (pvVar28->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar41 = (long)(pvVar28->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar40;
      if (sVar41 != 0) {
        memmove(paVar23,paVar40,sVar41);
      }
      paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar1 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = ((long)paVar1 - (long)paVar40 >> 2) * -0x5555555555555555;
      uVar47 = 0xffffffffffffffff;
      if (SUB168(auVar14 * ZEXT816(0xc),8) == 0) {
        uVar47 = SUB168(auVar14 * ZEXT816(0xc),0);
      }
      paVar23 = (aiVector3D *)operator_new__(uVar47);
      lVar46 = (long)paVar1 - (long)paVar40;
      if (lVar46 != 0) {
        memset(paVar23,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mBitangents = paVar23;
      paVar40 = (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &this_02->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      sVar41 = (long)this_02->_M_string_length - (long)paVar40;
      if (sVar41 != 0) {
        memmove(paVar23,paVar40,sVar41);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  lVar46 = 0;
  do {
    pvVar29 = MeshGeometry::GetTextureCoords(mesh,(uint)lVar46);
    if ((pvVar29->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (pvVar29->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) break;
    paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar1 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = ((long)paVar1 - (long)paVar40 >> 2) * -0x5555555555555555;
    uVar47 = SUB168(auVar15 * ZEXT816(0xc),0);
    if (SUB168(auVar15 * ZEXT816(0xc),8) != 0) {
      uVar47 = 0xffffffffffffffff;
    }
    paVar23 = (aiVector3D *)operator_new__(uVar47);
    lVar44 = (long)paVar1 - (long)paVar40;
    if (lVar44 != 0) {
      memset(paVar23,0,((lVar44 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mTextureCoords[lVar46] = paVar23;
    paVar6 = (pvVar29->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (paVar30 = (pvVar29->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar30 != paVar6;
        paVar30 = paVar30 + 1) {
      fVar49 = paVar30->y;
      paVar23->x = paVar30->x;
      paVar23->y = fVar49;
      paVar23->z = 0.0;
      paVar23 = paVar23 + 1;
    }
    out->mNumUVComponents[lVar46] = 2;
    lVar46 = lVar46 + 1;
  } while (lVar46 != 8);
  uVar47 = 0;
  local_70 = mesh;
  do {
    geo = local_70;
    iVar42._M_current = (aiAnimMesh **)(uVar47 & 0xffffffff);
    pvVar31 = MeshGeometry::GetVertexColors(local_70,(uint)uVar47);
    if ((pvVar31->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar31->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    paVar40 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    paVar1 = (pvVar21->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar46 = (long)paVar40 - (long)paVar1 >> 2;
    __n = lVar46 * -0x5555555555555550;
    sVar41 = __n;
    if (0xfffffffffffffff < (ulong)(lVar46 * -0x5555555555555555)) {
      sVar41 = 0xffffffffffffffff;
    }
    __s = (aiColor4D *)operator_new__(sVar41);
    if (paVar40 != paVar1) {
      memset(__s,0,__n);
    }
    out->mColors[uVar47] = __s;
    iVar42._M_current =
         (aiAnimMesh **)
         (pvVar31->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_start;
    sVar41 = (long)(pvVar31->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)iVar42._M_current;
    if (sVar41 != 0) {
      memmove(__s,iVar42._M_current,sVar41);
    }
    uVar47 = uVar47 + 1;
    geo = local_70;
  } while (uVar47 != 8);
  this_01 = local_a8;
  if ((local_a8->doc->settings->readMaterials == true) &&
     (pvVar7 = (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
     pvVar7 != (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish)) {
    iVar42._M_current = (aiAnimMesh **)out;
    ConvertMaterialForMesh(local_a8,out,local_d0,geo,*pvVar7);
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x17661f);
    uVar20 = GetDefaultMaterial(this_01);
    out->mMaterialIndex = uVar20;
  }
  if ((this_01->doc->settings->readWeights == true) &&
     (pSVar32 = Geometry::DeformerSkin(&geo->super_Geometry), pSVar32 != (Skin *)0x0)) {
    iVar42._M_current = (aiAnimMesh **)out;
    ConvertWeights(local_a8,out,local_d0,geo,local_d8,0xffffffff,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  }
  local_c8 = (aiAnimMesh **)0x0;
  iStack_c0._M_current = (aiAnimMesh **)0x0;
  local_b8 = (aiAnimMesh **)0x0;
  pvVar33 = Geometry::GetBlendShapes(&geo->super_Geometry);
  ppBVar34 = (pvVar33->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_68 = (pvVar33->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar34 != local_68) {
    do {
      ppBVar35 = ((*ppBVar34)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_58 = ((*ppBVar34)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_60 = ppBVar34;
      if (ppBVar35 != local_58) {
        do {
          local_e0 = *ppBVar35;
          local_50 = ppBVar35;
          if ((local_e0->shapeGeometries).
              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (local_e0->shapeGeometries).
              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar47 = 0;
            do {
              local_f0 = aiCreateAnimMesh(out);
              ppSVar8 = (local_e0->shapeGeometries).
                        super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(local_e0->shapeGeometries).
                                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar8 >> 3) <=
                  uVar47) {
LAB_00176c77:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar47);
                goto LAB_00176c88;
              }
              this_00 = ppSVar8[uVar47];
              local_38 = ShapeGeometry::GetVertices(this_00);
              local_40 = ShapeGeometry::GetNormals(this_00);
              pvVar22 = ShapeGeometry::GetIndices(this_00);
              paVar16 = local_f0;
              local_48 = uVar47;
              FixAnimMeshName(&local_98,(FBXConverter *)iVar42._M_current,
                              &(this_00->super_Geometry).super_Object.name);
              sVar18 = local_98._M_string_length;
              if (local_98._M_string_length < 0x400) {
                (paVar16->mName).length = (ai_uint32)local_98._M_string_length;
                memcpy((paVar16->mName).data,local_98._M_dataplus._M_p,local_98._M_string_length);
                (paVar16->mName).data[sVar18] = '\0';
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
              puVar36 = (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              if ((pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish != puVar36) {
                uVar47 = 0;
                do {
                  paVar40 = (local_38->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  uVar39 = ((long)(local_38->
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar40 >> 2)
                           * -0x5555555555555555;
                  if (uVar39 < uVar47 || uVar39 - uVar47 == 0) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar47);
LAB_00176c66:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar47);
                    goto LAB_00176c77;
                  }
                  paVar1 = (local_40->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  uVar39 = ((long)(local_40->
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 2) *
                           -0x5555555555555555;
                  if (uVar39 < uVar47 || uVar39 - uVar47 == 0) goto LAB_00176c66;
                  local_d8 = (aiMatrix4x4 *)CONCAT44(local_d8._4_4_,paVar40[uVar47].x);
                  local_e4 = paVar40[uVar47].y;
                  local_e8 = paVar40[uVar47].z;
                  fVar49 = paVar1[uVar47].x;
                  local_d0 = (Model *)CONCAT44(local_d0._4_4_,paVar1[uVar47].y);
                  local_a0 = (MatIndexArray *)CONCAT44(local_a0._4_4_,paVar1[uVar47].z);
                  local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
                  puVar37 = MeshGeometry::ToOutputVertexIndex(geo,puVar36[uVar47],(uint *)&local_98)
                  ;
                  if ((int)local_98._M_dataplus._M_p != 0) {
                    uVar39 = 0;
                    fVar50 = local_d8._0_4_;
                    fVar51 = local_e4;
                    fVar52 = local_e8;
                    do {
                      uVar20 = puVar37[uVar39];
                      paVar23 = local_f0->mVertices;
                      paVar23[uVar20].x = paVar23[uVar20].x + fVar50;
                      paVar23[uVar20].y = paVar23[uVar20].y + fVar51;
                      paVar23[uVar20].z = paVar23[uVar20].z + fVar52;
                      paVar23 = local_f0->mNormals;
                      if (paVar23 != (aiVector3D *)0x0) {
                        paVar23[uVar20].x = paVar23[uVar20].x + fVar49;
                        paVar23[uVar20].y = paVar23[uVar20].y + local_d0._0_4_;
                        paVar23[uVar20].z = paVar23[uVar20].z + local_a0._0_4_;
                        paVar23 = local_f0->mNormals;
                        fVar48 = paVar23[uVar20].z * paVar23[uVar20].z +
                                 paVar23[uVar20].x * paVar23[uVar20].x +
                                 paVar23[uVar20].y * paVar23[uVar20].y;
                        if (fVar48 < 0.0) {
                          fVar48 = sqrtf(fVar48);
                          fVar50 = local_d8._0_4_;
                          fVar51 = local_e4;
                          fVar52 = local_e8;
                        }
                        else {
                          fVar48 = SQRT(fVar48);
                        }
                        if (0.0 < fVar48) {
                          paVar23 = paVar23 + uVar20;
                          fVar48 = 1.0 / fVar48;
                          paVar23->x = paVar23->x * fVar48;
                          paVar23->y = paVar23->y * fVar48;
                          paVar23->z = fVar48 * paVar23->z;
                        }
                      }
                      uVar39 = uVar39 + 1;
                    } while (uVar39 < ((ulong)local_98._M_dataplus._M_p & 0xffffffff));
                  }
                  uVar47 = uVar47 + 1;
                  puVar36 = (pvVar22->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  geo = local_70;
                } while (uVar47 < (ulong)((long)(pvVar22->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)puVar36 >> 2));
              }
              uVar47 = local_48;
              fVar49 = 1.0;
              if (8 < (ulong)((long)(local_e0->shapeGeometries).
                                    super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_e0->shapeGeometries).
                                   super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
                fVar49 = local_e0->percent / 100.0;
              }
              local_f0->mWeight = fVar49;
              iVar42._M_current = iStack_c0._M_current;
              if (iStack_c0._M_current == local_b8) {
                std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
                _M_realloc_insert<aiAnimMesh*const&>
                          ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&local_c8,iStack_c0,
                           &local_f0);
              }
              else {
                *iStack_c0._M_current = local_f0;
                iStack_c0._M_current = iStack_c0._M_current + 1;
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 < (ulong)((long)(local_e0->shapeGeometries).
                                            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_e0->shapeGeometries).
                                            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          ppBVar35 = local_50 + 1;
        } while (ppBVar35 != local_58);
      }
      ppBVar34 = local_60 + 1;
    } while (ppBVar34 != local_68);
  }
  iVar42._M_current = iStack_c0._M_current;
  ppaVar17 = local_c8;
  if ((long)iStack_c0._M_current - (long)local_c8 != 0) {
    uVar47 = (long)iStack_c0._M_current - (long)local_c8 >> 3;
    out->mNumAnimMeshes = (uint)uVar47;
    ppaVar38 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar47 >> 0x3d != 0) |
                              (long)iStack_c0._M_current - (long)local_c8);
    out->mAnimMeshes = ppaVar38;
    if (iVar42._M_current != ppaVar17) {
      uVar39 = 0;
      do {
        if ((ulong)((long)iStack_c0._M_current - (long)local_c8 >> 3) <= uVar39) goto LAB_00176c88;
        out->mAnimMeshes[uVar39] = local_c8[uVar39];
        uVar39 = uVar39 + 1;
      } while (uVar47 + (uVar47 == 0) != uVar39);
    }
  }
  ppaVar9 = (local_a8->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar10 = (local_a8->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_c8 != (aiAnimMesh **)0x0) {
    operator_delete(local_c8);
  }
  return (int)((ulong)((long)ppaVar10 - (long)ppaVar9) >> 3) - 1;
LAB_00176c88:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00176c96:
  __assert_fail("normals.size() == vertices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0x444,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
               );
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != NULL) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, NO_MATERIAL_SEPARATION);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }